

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu540c.c
# Opt level: O2

MPP_RET hal_h265e_v540c_gen_regs(void *hal,HalEncTask *task)

{
  ushort uVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  void *__s;
  uint *puVar7;
  long lVar8;
  EncRcTask *pEVar9;
  void *pvVar10;
  MppDev dev;
  uint uVar11;
  uint uVar12;
  MppFrameFormat MVar13;
  RK_U32 offset;
  MPP_RET MVar14;
  VepuRgb2YuvCfg *pVVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  byte bVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  RK_U32 *__src;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  undefined2 uVar35;
  uint uVar36;
  uint uVar37;
  RK_U32 offset_00;
  ushort uVar38;
  bool bVar39;
  undefined1 auVar40 [16];
  
  pvVar6 = (task->syntax).data;
  __s = *(void **)((long)hal + 0x70);
  puVar7 = *(uint **)((long)hal + 0x1d8);
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v540c","(%d) enter\n",(char *)0x0,0x4b9);
  }
  uVar38 = *(ushort *)((long)pvVar6 + 4);
  uVar1 = *(ushort *)((long)pvVar6 + 6);
  if ((hal_h265e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h265e_v540c","frame %d | type %d | start gen regs","hal_h265e_v540c_gen_regs",
               (ulong)*(uint *)((long)hal + 0x1b4),(ulong)*(uint *)((long)hal + 0x1ac));
  }
  memset(__s,0,0x1790);
  *(uint *)((long)__s + 0x10) = (*(uint *)((long)hal + 0x1c8) & 7) << 8;
  *(undefined4 *)((long)__s + 0x14) = 0;
  *(undefined4 *)((long)__s + 0x20) = 0xfdf7;
  *(undefined4 *)((long)__s + 0x30) = 0x7000;
  *(undefined8 *)((long)__s + 0x34) = 0xff1fffff00000000;
  *(undefined8 *)((long)__s + 0x54) = 0xffffffff00000007;
  uVar37 = (uVar38 + 7 >> 3) + 0x7ff;
  *(uint *)((long)__s + 0x1c4) = uVar37 & 0x7ff;
  uVar11 = *(ushort *)((long)pvVar6 + 4) & 7;
  uVar12 = 8 - uVar11;
  if ((*(ushort *)((long)pvVar6 + 4) & 7) == 0) {
    uVar12 = uVar11;
  }
  *(uint *)((long)__s + 0x1c8) = uVar12;
  *(uint *)((long)__s + 0x1c4) = ((uint)uVar1 * 0x2000 + 0x7ffe000 | uVar37) & 0x7ff07ff;
  uVar37 = *(ushort *)((long)pvVar6 + 6) & 7;
  uVar11 = (8 - uVar37) * 0x10000;
  if ((*(ushort *)((long)pvVar6 + 6) & 7) == 0) {
    uVar11 = uVar37;
  }
  *(uint *)((long)__s + 0x1c8) = uVar11 | uVar12;
  *(undefined4 *)((long)__s + 0x1b4) = 1;
  *(uint *)((long)__s + 0x1b4) = (uint)(*(int *)((long)pvVar6 + 0x120) == 0) * 4 + 0x11;
  uVar12 = mpp_log2((uVar38 + 0x1f >> 4 & 0xfffffffe) * (uVar1 + 0x1f >> 5) - 2);
  *(uint *)((long)__s + 0x1b4) = *(uint *)((long)__s + 0x1b4) & 0xff07ffff | (uVar12 & 0x1f) << 0x13
  ;
  *(byte *)((long)__s + 0x1e3) = *(byte *)((long)__s + 0x1e3) & 0xe3;
  uVar12 = 0x406;
  if (*(int *)((long)hal + 0x1ac) != 2) {
    uVar12 = (uint)(*(int *)(*(long *)((long)hal + 0x1c0) + 0x1864) == 1) * 3 + 0x406;
  }
  *(uint *)((long)__s + 0x3b4) = *(uint *)((long)__s + 0x3b4) & 0xffffc0f0 | uVar12;
  *(uint *)((long)__s + 0x294) = *(uint *)((long)__s + 0x294) & 0xfffffff8 | 5;
  *(uint *)((long)__s + 0x228) = *(uint *)((long)__s + 0x228) & 0x88000000 | 0xf20048;
  *(undefined4 *)((long)__s + 0x224) = 0x1ccef;
  if (((*(byte *)((long)pvVar6 + 0x26) & 4) != 0) && (*(int *)((long)hal + 0x1ac) != 2)) {
    uVar12 = 0xc0000000;
    if (*(int *)((long)hal + 0x1b0) == 2) {
      uVar12 = 0x40000000;
    }
    *(uint *)((long)__s + 0x22c) = uVar12 | *(uint *)((long)__s + 0x22c) & 0x3fffffff;
  }
  uVar11 = (*(uint *)((long)__s + 0x1c4) & 0x7ff) * 0x10000 + 0x4e000;
  uVar36 = uVar11 >> 0x12;
  uVar12 = 0x23;
  uVar37 = 4;
  for (iVar28 = 0; (uVar20 = uVar12 * 0xd + iVar28, uVar37 < 0x24 && (uVar20 < 0x704));
      iVar28 = iVar28 + uVar36 * 4) {
    uVar37 = uVar37 + 4;
    bVar39 = uVar12 < 9;
    uVar12 = uVar12 - 4;
    if (bVar39) {
      uVar12 = 4;
    }
  }
  uVar12 = uVar37 - 4;
  if (uVar20 < 0x705) {
    uVar12 = uVar37;
  }
  *(uint *)((long)__s + 0x22c) =
       (uVar11 & 0xffc0000 | *(uint *)((long)__s + 0x22c) & 0xc0030400 | (uVar12 & 0x3c) << 10) +
       ((uVar12 + 0xffc) * uVar36 + 0x34 >> 2 & 0x3ff) + 0x10000000;
  uVar12 = *(uint *)((long)__s + 0x254);
  *(uint *)((long)__s + 0x254) = uVar12 & 0xc3878003 | 0x3c700490;
  uVar11 = uVar12 & 0xc3878000 | 0x3c700490;
  uVar12 = uVar11 + 2;
  if (*(char *)((long)pvVar6 + 0x1e) == '\0') {
    uVar12 = uVar11;
  }
  *(uint *)((long)__s + 0x254) = uVar12 | 0x800000;
  *(uint *)((long)__s + 0x254) =
       uVar12 & 0xfcf78492 | 0x800000 | (*(uint *)((long)pvVar6 + 0x24) & 1) << 0x18;
  uVar12 = 1;
  if (*(int *)((long)hal + 0x1ac) == 2) {
    uVar12 = 0x13;
  }
  uVar11 = 3;
  if (*(int *)((long)pvVar6 + 0x124) == 0) {
    uVar11 = uVar12;
  }
  *(uint *)((long)__s + 0x264) = *(uint *)((long)__s + 0x264) & 0xffffffc0 | uVar11;
  vepu540c_h265_set_hw_address
            ((H265eV540cHalContext *)hal,(hevc_vepu540c_base *)((long)__s + 0x124),task);
  lVar8 = *(long *)((long)hal + 0x1c0);
  *(uint *)((long)__s + 0x30) = *(uint *)((long)__s + 0x30) & 0xffffff0f | (puVar7[4] & 0xf) << 4;
  uVar11 = *puVar7;
  uVar12 = *(uint *)((long)__s + 0x1cc);
  uVar36 = uVar11 * 4 & 0x3c;
  *(uint *)((long)__s + 0x1cc) = uVar12 & 0xffffffc3 | uVar36;
  uVar37 = puVar7[1];
  *(uint *)((long)__s + 0x1cc) = uVar12 & 0xffffffc2 | uVar36 | uVar37 & 1;
  uVar12 = (uVar12 & 0xffffffc0 | uVar36 | uVar37 & 1) + (puVar7[2] & 1) * 2;
  *(uint *)((long)__s + 0x1cc) = uVar12;
  *(uint *)((long)__s + 0x1cc) = uVar12 & 0xffffff7f | (uint)(*(int *)(lVar8 + 0x24) != 0xc) << 7;
  uVar12 = *(uint *)((long)__s + 0x1e0);
  uVar37 = (uint)(0 < *(int *)(lVar8 + 0x58)) << 0x1a;
  *(uint *)((long)__s + 0x1e0) = uVar12 & 0xfbffffff | uVar37;
  *(uint *)((long)__s + 0x1e0) =
       uVar12 & 0xe3ffffff | uVar37 | (*(uint *)(lVar8 + 0x50) & 3) << 0x1b;
  uVar12 = *(uint *)(lVar8 + 0x14);
  uVar11 = uVar11 & 0xf;
  if (uVar12 != 0) goto switchD_0024928a_caseD_3;
  uVar12 = 0;
  switch(uVar11) {
  case 0:
    uVar12 = *(int *)(lVar8 + 0xc) << 2;
    break;
  case 1:
    uVar12 = *(int *)(lVar8 + 0xc) * 3;
    break;
  case 2:
  case 8:
  case 9:
    uVar12 = *(int *)(lVar8 + 0xc) * 2;
  default:
switchD_0024928a_caseD_3:
    uVar35 = (undefined2)uVar12;
    if ((uVar11 | 2) != 6) break;
    goto LAB_002492a8;
  }
  uVar35 = (undefined2)((int)uVar12 / 2);
LAB_002492a8:
  if (uVar36 < 0xc) {
    pVVar15 = get_rgb2yuv_cfg(*(MppFrameColorRange *)(lVar8 + 0x34),
                              *(MppFrameColorSpace *)(lVar8 + 0x28));
    bVar39 = true;
    if ((hal_h265e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h265e_v540c","input color range %d colorspace %d",
                 "vepu540c_h265_set_pp_regs",(ulong)*(uint *)(lVar8 + 0x34),
                 (ulong)*(uint *)(lVar8 + 0x28));
      bVar39 = (hal_h265e_debug & 2) == 0;
    }
    uVar37 = ((ushort)(pVVar15->_2y).r_coeff & 0x1ff) << 0x12;
    uVar11 = *(uint *)((long)__s + 0x1d0);
    *(uint *)((long)__s + 0x1d0) = uVar11 & 0xf803ffff | uVar37;
    uVar36 = ((ushort)(pVVar15->_2y).g_coeff & 0x1ff) << 9;
    *(uint *)((long)__s + 0x1d0) = uVar11 & 0xf80001ff | uVar37 | uVar36;
    *(uint *)((long)__s + 0x1d0) =
         uVar11 & 0xf8000000 | uVar37 | uVar36 | (ushort)(pVVar15->_2y).b_coeff & 0x1ff;
    uVar37 = ((ushort)(pVVar15->_2u).r_coeff & 0x1ff) << 0x12;
    uVar11 = *(uint *)((long)__s + 0x1d4);
    *(uint *)((long)__s + 0x1d4) = uVar11 & 0xf803ffff | uVar37;
    uVar36 = ((ushort)(pVVar15->_2u).g_coeff & 0x1ff) << 9;
    *(uint *)((long)__s + 0x1d4) = uVar11 & 0xf80001ff | uVar37 | uVar36;
    *(uint *)((long)__s + 0x1d4) =
         uVar11 & 0xf8000000 | uVar37 | uVar36 | (ushort)(pVVar15->_2u).b_coeff & 0x1ff;
    uVar37 = ((ushort)(pVVar15->_2v).r_coeff & 0x1ff) << 0x12;
    uVar11 = *(uint *)((long)__s + 0x1d8);
    *(uint *)((long)__s + 0x1d8) = uVar11 & 0xf803ffff | uVar37;
    uVar36 = ((ushort)(pVVar15->_2v).g_coeff & 0x1ff) << 9;
    *(uint *)((long)__s + 0x1d8) = uVar11 & 0xf80001ff | uVar37 | uVar36;
    *(uint *)((long)__s + 0x1d8) =
         uVar11 & 0xf8000000 | uVar37 | uVar36 | (ushort)(pVVar15->_2v).b_coeff & 0x1ff;
    uVar11 = *(uint *)((long)__s + 0x1dc);
    uVar37 = ((ushort)(pVVar15->_2y).offset & 0x1f) << 0x10;
    *(uint *)((long)__s + 0x1dc) = uVar11 & 0xffe0ffff | uVar37;
    uVar11 = uVar11 & 0xffe000ff | uVar37 | ((ushort)(pVVar15->_2u).offset & 0xff) << 8;
    *(uint *)((long)__s + 0x1dc) = uVar11;
    *(uint *)((long)__s + 0x1dc) = CONCAT31((int3)(uVar11 >> 8),(char)(pVVar15->_2v).offset);
    if (!bVar39) {
      _mpp_log_l(4,"hal_h265e_v540c","use color range %d colorspace %d","vepu540c_h265_set_pp_regs",
                 (ulong)pVVar15->dst_range,(ulong)pVVar15->color);
    }
  }
  *(uint *)((long)__s + 0x1e8) = *(uint *)((long)__s + 0x1e8) & 0xfffe0000 | uVar12 & 0x1ffff;
  *(undefined2 *)((long)__s + 0x1ec) = uVar35;
  pEVar9 = task->rc_task;
  lVar8 = *(long *)((long)hal + 0x1c0);
  if (*(int *)(lVar8 + 0x94) == 2) {
    *(uint *)((long)__s + 0x1b4) =
         *(uint *)((long)__s + 0x1b4) & 0xffffc0ff | ((pEVar9->info).quality_target & 0x3fU) << 8;
    *(uint *)((long)__s + 0x274) =
         *(uint *)((long)__s + 0x274) & 0xffc0ffff | ((pEVar9->info).quality_target & 0x3fU) << 0x10
    ;
    uVar12 = *(uint *)((long)__s + 0x208);
    uVar11 = ((pEVar9->info).quality_target & 0x3fU) << 0x14;
    *(uint *)((long)__s + 0x208) = uVar12 & 0xfc0fffff | uVar11;
    *(uint *)((long)__s + 0x208) = uVar12 & 0xfffff | uVar11 | (pEVar9->info).quality_target << 0x1a
    ;
  }
  else {
    pvVar10 = (task->syntax).data;
    uVar37 = *(ushort *)((long)pvVar10 + 4) + 0x1f >> 5;
    uVar11 = ((pEVar9->info).bit_target << 4) /
             (int)((*(ushort *)((long)pvVar10 + 6) + 0x1f >> 5) * uVar37);
    uVar12 = 0x50000;
    if (uVar11 < 0x100000) {
      uVar12 = uVar11;
    }
    uVar36 = (uVar12 * uVar37 >> 4) * 5 >> 4;
    *(uint *)((long)__s + 0x1b4) =
         *(uint *)((long)__s + 0x1b4) & 0xffffc0ff | ((pEVar9->info).quality_target & 0x3fU) << 8;
    *(uint *)((long)__s + 0x274) =
         *(uint *)((long)__s + 0x274) & 0xffc0ffff | ((pEVar9->info).quality_target & 0x3fU) << 0x10
    ;
    *(uint *)((long)__s + 0x204) = uVar37 * 0x1000 + (*(uint *)((long)__s + 0x204) & 0xff8) + 3;
    uVar37 = (*(uint *)(lVar8 + 0x17c + (ulong)(*(int *)((long)hal + 0x1ac) == 2) * 4) & 0xf) <<
             0x10;
    uVar11 = *(uint *)((long)__s + 0x208);
    *(uint *)((long)__s + 0x208) = uVar11 & 0xfff0ffff | uVar37;
    uVar20 = ((pEVar9->info).quality_max & 0x3fU) << 0x14;
    *(uint *)((long)__s + 0x208) = uVar11 & 0xfc00ffff | uVar37 | uVar20;
    *(uint *)((long)__s + 0x208) =
         uVar11 & 0xffff | uVar37 | uVar20 | (pEVar9->info).quality_min << 0x1a;
    *(uint *)((long)__s + 0x20c) = *(uint *)((long)__s + 0x20c) & 0xfff00000 | uVar12 & 0xfffff;
    *(uint *)((long)__s + 0x340) = uVar36 * -4;
    *(uint *)((long)__s + 0x344) = -uVar36;
    *(uint *)((long)__s + 0x348) = uVar36;
    *(uint *)((long)__s + 0x34c) = uVar36 << 2;
    *(undefined8 *)((long)__s + 0x350) = 0x7fffffff7fffffff;
    *(undefined8 *)((long)__s + 0x358) = 0x7fffffff7fffffff;
    *(undefined4 *)((long)__s + 0x360) = 0x7fffffff;
    *(uint *)((long)__s + 0x338) = *(uint *)((long)__s + 0x338) & 0xfe000000 | 0x2083fe;
    *(uint *)((long)__s + 0x33c) = *(uint *)((long)__s + 0x33c) & 0xfff00000;
  }
  uVar12 = (uint)*(byte *)(lVar8 + 0x3b0);
  if (*(byte *)(lVar8 + 0x3b0) == 0) {
    uVar12 = (pEVar9->info).quality_min;
  }
  uVar11 = *(uint *)((long)__s + 0x368);
  uVar12 = uVar12 & 0x3f;
  *(uint *)((long)__s + 0x368) = uVar11 & 0xffffffc0 | uVar12;
  uVar37 = (uint)*(byte *)(lVar8 + 0x3a8);
  if (*(byte *)(lVar8 + 0x3a8) == 0) {
    uVar37 = (pEVar9->info).quality_max;
  }
  uVar36 = (uVar37 & 0x3f) << 6;
  *(uint *)((long)__s + 0x368) = uVar11 & 0xfffff000 | uVar12 | uVar36;
  uVar37 = (uint)*(byte *)(lVar8 + 0x3b1);
  if (*(byte *)(lVar8 + 0x3b1) == 0) {
    uVar37 = (pEVar9->info).quality_min;
  }
  uVar20 = (uVar37 & 0x3f) << 0xc;
  *(uint *)((long)__s + 0x368) = uVar11 & 0xfffc0000 | uVar12 | uVar36 | uVar20;
  uVar37 = (uint)*(byte *)(lVar8 + 0x3a9);
  if (*(byte *)(lVar8 + 0x3a9) == 0) {
    uVar37 = (pEVar9->info).quality_max;
  }
  uVar17 = (uVar37 & 0x3f) << 0x12;
  *(uint *)((long)__s + 0x368) = uVar11 & 0xff000000 | uVar12 | uVar36 | uVar20 | uVar17;
  uVar37 = (uint)*(byte *)(lVar8 + 0x3b2);
  if (*(byte *)(lVar8 + 0x3b2) == 0) {
    uVar37 = (pEVar9->info).quality_min;
  }
  *(uint *)((long)__s + 0x368) =
       uVar11 & 0xc0000000 | uVar12 | uVar36 | uVar20 | uVar17 | (uVar37 & 0x3f) << 0x18;
  uVar12 = (uint)*(byte *)(lVar8 + 0x3aa);
  if (*(byte *)(lVar8 + 0x3aa) == 0) {
    uVar12 = (pEVar9->info).quality_max;
  }
  uVar11 = *(uint *)((long)__s + 0x36c);
  uVar12 = uVar12 & 0x3f;
  *(uint *)((long)__s + 0x36c) = uVar11 & 0xffffffc0 | uVar12;
  uVar37 = (uint)*(byte *)(lVar8 + 0x3b3);
  if (*(byte *)(lVar8 + 0x3b3) == 0) {
    uVar37 = (pEVar9->info).quality_min;
  }
  uVar36 = (uVar37 & 0x3f) << 6;
  *(uint *)((long)__s + 0x36c) = uVar11 & 0xfffff000 | uVar12 | uVar36;
  uVar37 = (uint)*(byte *)(lVar8 + 0x3ab);
  if (*(byte *)(lVar8 + 0x3ab) == 0) {
    uVar37 = (pEVar9->info).quality_max;
  }
  uVar20 = (uVar37 & 0x3f) << 0xc;
  *(uint *)((long)__s + 0x36c) = uVar11 & 0xfffc0000 | uVar12 | uVar36 | uVar20;
  uVar37 = (uint)*(byte *)(lVar8 + 0x3b4);
  if (*(byte *)(lVar8 + 0x3b4) == 0) {
    uVar37 = (pEVar9->info).quality_min;
  }
  uVar17 = (uVar37 & 0x3f) << 0x12;
  *(uint *)((long)__s + 0x36c) = uVar11 & 0xff000000 | uVar12 | uVar36 | uVar20 | uVar17;
  uVar37 = (uint)*(byte *)(lVar8 + 0x3ac);
  if (*(byte *)(lVar8 + 0x3ac) == 0) {
    uVar37 = (pEVar9->info).quality_max;
  }
  *(uint *)((long)__s + 0x36c) =
       uVar11 & 0xc0000000 | uVar12 | uVar36 | uVar20 | uVar17 | (uVar37 & 0x3f) << 0x18;
  uVar12 = (uint)*(byte *)(lVar8 + 0x3b5);
  if (*(byte *)(lVar8 + 0x3b5) == 0) {
    uVar12 = (pEVar9->info).quality_min;
  }
  uVar11 = *(uint *)((long)__s + 0x370);
  uVar12 = uVar12 & 0x3f;
  *(uint *)((long)__s + 0x370) = uVar11 & 0xffffffc0 | uVar12;
  uVar37 = (uint)*(byte *)(lVar8 + 0x3ad);
  if (*(byte *)(lVar8 + 0x3ad) == 0) {
    uVar37 = (pEVar9->info).quality_max;
  }
  uVar36 = (uVar37 & 0x3f) << 6;
  *(uint *)((long)__s + 0x370) = uVar11 & 0xfffff000 | uVar12 | uVar36;
  uVar37 = (uint)*(byte *)(lVar8 + 0x3b6);
  if (*(byte *)(lVar8 + 0x3b6) == 0) {
    uVar37 = (pEVar9->info).quality_min;
  }
  uVar20 = (uVar37 & 0x3f) << 0xc;
  *(uint *)((long)__s + 0x370) = uVar11 & 0xfffc0000 | uVar12 | uVar36 | uVar20;
  uVar37 = (uint)*(byte *)(lVar8 + 0x3ae);
  if (*(byte *)(lVar8 + 0x3ae) == 0) {
    uVar37 = (pEVar9->info).quality_max;
  }
  uVar17 = (uVar37 & 0x3f) << 0x12;
  *(uint *)((long)__s + 0x370) = uVar11 & 0xff000000 | uVar12 | uVar36 | uVar20 | uVar17;
  uVar37 = (uint)*(byte *)(lVar8 + 0x3b7);
  if (*(byte *)(lVar8 + 0x3b7) == 0) {
    uVar37 = (pEVar9->info).quality_min;
  }
  *(uint *)((long)__s + 0x370) =
       uVar11 & 0xc0000000 | uVar12 | uVar36 | uVar20 | uVar17 | (uVar37 & 0x3f) << 0x18;
  uVar12 = (uint)*(byte *)(lVar8 + 0x3af);
  if (*(byte *)(lVar8 + 0x3af) == 0) {
    uVar12 = (pEVar9->info).quality_max;
  }
  uVar11 = *(uint *)((long)__s + 0x268);
  uVar37 = *(uint *)((long)__s + 0x374);
  *(uint *)((long)__s + 0x374) = uVar37 & 0xffffffc0 | uVar12 & 0x3f;
  *(uint *)((long)__s + 0x374) =
       uVar37 & 0x3fffffc0 | uVar12 & 0x3f | *(int *)(lVar8 + 0x3b8) << 0x1e;
  uVar12 = *(uint *)((long)pvVar6 + 0x24) >> 2 & 1;
  *(uint *)((long)__s + 0x268) = uVar11 & 0xfffffffe | uVar12;
  uVar37 = (uint)(byte)(*(char *)((long)pvVar6 + 0x1d) * '\x02');
  *(uint *)((long)__s + 0x268) = uVar11 & 0xffffff00 | uVar12 | uVar37;
  uVar36 = (*(byte *)((long)pvVar6 + 0x1e) & 0x3f) << 9;
  *(uint *)((long)__s + 0x268) = uVar11 & 0xffff8100 | uVar12 | uVar37 | uVar36;
  uVar20 = *(uint *)((long)pvVar6 + 0x24) >> 9 & 0x100;
  *(uint *)((long)__s + 0x268) = uVar11 & 0xffff8000 | uVar12 | uVar37 | uVar36 | uVar20;
  uVar17 = *(uint *)((long)pvVar6 + 0x24) >> 3 & 0x8000;
  *(uint *)((long)__s + 0x268) = uVar11 & 0xffff0000 | uVar12 | uVar37 | uVar36 | uVar20 | uVar17;
  uVar21 = (*(uint *)((long)pvVar6 + 0x14) & 0x1e00) << 7;
  *(uint *)((long)__s + 0x268) =
       uVar11 & 0xfff00000 | uVar12 | uVar37 | uVar36 | uVar20 | uVar17 | uVar21;
  *(uint *)((long)__s + 0x268) =
       (uVar11 & 0xffe00000 | uVar12 | uVar37 | uVar36 | uVar20 | uVar17 | uVar21) +
       (*(uint *)((long)pvVar6 + 0x24) & 0x80000) * 2;
  uVar11 = *(uint *)((long)pvVar6 + 0x24) >> 0x14 & 1;
  uVar12 = *(uint *)((long)__s + 0x26c);
  *(uint *)((long)__s + 0x26c) = uVar12 & 0xfffffffe | uVar11;
  uVar37 = *(uint *)((long)pvVar6 + 0x24) >> 0x14 & 2;
  *(uint *)((long)__s + 0x26c) = uVar12 & 0xfffffffc | uVar11 | uVar37;
  uVar36 = *(uint *)((long)pvVar6 + 0x24) >> 0x14 & 0x1c;
  *(uint *)((long)__s + 0x26c) = uVar12 & 0xffffffe0 | uVar11 | uVar37 | uVar36;
  uVar20 = *(uint *)((long)pvVar6 + 0x24) >> 0x14 & 0x20;
  *(uint *)((long)__s + 0x26c) = uVar12 & 0xffffffc0 | uVar11 | uVar37 | uVar36 | uVar20;
  uVar17 = *(uint *)((long)pvVar6 + 0x24) >> 0x14 & 0x40;
  *(uint *)((long)__s + 0x26c) = uVar12 & 0xffffff80 | uVar11 | uVar37 | uVar36 | uVar20 | uVar17;
  uVar21 = (uint)(*(char *)((long)pvVar6 + 0x21) + 0x1aU & 0x3f) << 7;
  *(uint *)((long)__s + 0x26c) =
       uVar12 & 0xffffe000 | uVar11 | uVar37 | uVar36 | uVar20 | uVar17 | uVar21;
  uVar18 = (*(uint *)((long)pvVar6 + 0x28) & 4) << 0xb;
  *(uint *)((long)__s + 0x26c) =
       uVar12 & 0xffffc000 | uVar11 | uVar37 | uVar36 | uVar20 | uVar17 | uVar21 | uVar18;
  uVar29 = (*(uint *)((long)pvVar6 + 0x28) & 8) << 0xb;
  *(uint *)((long)__s + 0x26c) =
       uVar12 & 0xffff8000 | uVar11 | uVar37 | uVar36 | uVar20 | uVar17 | uVar21 | uVar18 | uVar29;
  uVar30 = (*(uint *)((long)pvVar6 + 0x28) & 0x800) << 4;
  *(uint *)((long)__s + 0x26c) =
       uVar12 & 0xffff0000 | uVar11 | uVar37 | uVar36 | uVar20 | uVar17 | uVar21 | uVar18 | uVar29 |
       uVar30;
  uVar27 = (*(uint *)((long)pvVar6 + 0x28) & 0x1000) << 4;
  *(uint *)((long)__s + 0x26c) =
       uVar12 & 0xfffe0000 | uVar11 | uVar37 | uVar36 | uVar20 | uVar17 | uVar21 | uVar18 | uVar29 |
       uVar30 | uVar27;
  uVar12 = (uVar12 & 0xfffc0000 | uVar11 | uVar37 | uVar36 | uVar20 | uVar17 | uVar21 | uVar18 |
            uVar29 | uVar30 | uVar27) + (*(uint *)((long)pvVar6 + 0x28) & 0x4000) * 8;
  *(uint *)((long)__s + 0x26c) = uVar12;
  uVar12 = (uVar12 & 0xfffbffff) + (*(uint *)((long)pvVar6 + 0x28) & 0x8000) * 8;
  *(uint *)((long)__s + 0x26c) = uVar12;
  uVar11 = (*(byte *)((long)pvVar6 + 0xd0) & 3) << 0x13;
  *(uint *)((long)__s + 0x26c) = uVar12 & 0xffe7ffff | uVar11;
  *(uint *)((long)__s + 0x26c) =
       uVar12 & 0xffc7ffff | uVar11 | (*(uint *)((long)pvVar6 + 0x28) & 0x400) << 0xb;
  uVar11 = *(uint *)((long)pvVar6 + 0xe4) >> 4 & 1;
  uVar12 = *(uint *)((long)__s + 0x270);
  *(uint *)((long)__s + 0x270) = uVar12 & 0xfffffffe | uVar11;
  uVar37 = *(uint *)((long)pvVar6 + 0xe4) >> 4 & 2;
  *(uint *)((long)__s + 0x270) = uVar12 & 0xfffffffc | uVar11 | uVar37;
  uVar36 = *(uint *)((long)pvVar6 + 0xe4) >> 4 & 4;
  *(uint *)((long)__s + 0x270) = uVar12 & 0xfffffff8 | uVar11 | uVar37 | uVar36;
  uVar20 = *(uint *)((long)pvVar6 + 0xe4) >> 4 & 8;
  *(uint *)((long)__s + 0x270) = uVar12 & 0xfffffff0 | uVar11 | uVar37 | uVar36 | uVar20;
  uVar17 = *(uint *)((long)pvVar6 + 0xe4) >> 3 & 0x20;
  *(uint *)((long)__s + 0x270) = uVar12 & 0xffffffd0 | uVar11 | uVar37 | uVar36 | uVar20 | uVar17;
  uVar21 = (uint)(byte)(*(char *)((long)pvVar6 + 0xf0) << 6);
  *(uint *)((long)__s + 0x270) =
       uVar12 & 0xffffff10 | uVar11 | uVar37 | uVar36 | uVar20 | uVar17 | uVar21;
  uVar18 = (*(byte *)((long)pvVar6 + 0xf1) & 3) << 8;
  *(uint *)((long)__s + 0x270) =
       uVar12 & 0xfffffc10 | uVar11 | uVar37 | uVar36 | uVar20 | uVar17 | uVar21 | uVar18;
  uVar12 = (uVar12 & 0xfffff810 | uVar11 | uVar37 | uVar36 | uVar20 | uVar17 | uVar21 | uVar18) +
           (*(uint *)((long)pvVar6 + 0xe4) & 0x200) * 2;
  *(uint *)((long)__s + 0x270) = uVar12;
  uVar12 = (uVar12 & 0xfffff7ff) + (*(uint *)((long)pvVar6 + 0xe4) & 0x400) * 2;
  *(uint *)((long)__s + 0x270) = uVar12;
  uVar12 = (uVar12 & 0xffffefff) + (*(uint *)((long)pvVar6 + 0xe4) & 0x800) * 2;
  *(uint *)((long)__s + 0x270) = uVar12;
  uVar12 = (uVar12 & 0xffffdfff) + (*(uint *)((long)pvVar6 + 0xe4) & 0x1000) * 2;
  *(uint *)((long)__s + 0x270) = uVar12;
  *(uint *)((long)__s + 0x1b4) =
       *(uint *)((long)__s + 0x1b4) & 0xfff83fff | (*(uint *)((long)pvVar6 + 0x11c) & 0x1f) << 0xe;
  uVar12 = (uVar12 & 0xffffbfff) + (*(uint *)((long)pvVar6 + 0xe4) & 0x2000) * 2;
  *(uint *)((long)__s + 0x270) = uVar12;
  uVar29 = (*(byte *)((long)pvVar6 + 0xf2) & 3) << 0xf;
  *(uint *)((long)__s + 0x270) = uVar12 & 0xfffe7fff | uVar29;
  uVar30 = (*(byte *)((long)pvVar6 + 0xf3) & 0x7f) << 0x11;
  *(uint *)((long)__s + 0x270) = uVar12 & 0xff007fff | uVar29 | uVar30;
  uVar22 = (*(uint *)((long)pvVar6 + 0xe4) & 0x4000) << 10;
  *(uint *)((long)__s + 0x270) = uVar12 & 0xfe007fff | uVar29 | uVar30 | uVar22;
  uVar23 = (*(byte *)((long)pvVar6 + 0xf4) & 0x3f) << 0x19;
  *(uint *)((long)__s + 0x270) = uVar12 & 0x80007fff | uVar29 | uVar30 | uVar22 | uVar23;
  uVar24 = (*(uint *)((long)pvVar6 + 0xe4) & 0x8000) << 0x10;
  *(uint *)((long)__s + 0x270) = uVar12 & 0x7fff | uVar29 | uVar30 | uVar22 | uVar23 | uVar24;
  uVar37 = *(uint *)((long)__s + 0x274);
  uVar31 = *(byte *)((long)pvVar6 + 0xea) & 0xf;
  *(uint *)((long)__s + 0x274) = uVar37 & 0xfffffff0 | uVar31;
  uVar32 = (uint)(byte)(*(char *)((long)pvVar6 + 0xeb) << 4);
  *(uint *)((long)__s + 0x274) = uVar37 & 0xffffff00 | uVar31 | uVar32;
  uVar33 = *(uint *)((long)pvVar6 + 0xe4) >> 8 & 0x100;
  *(uint *)((long)__s + 0x274) = uVar37 & 0xfffffe00 | uVar31 | uVar32 | uVar33;
  uVar36 = *(uint *)((long)pvVar6 + 0xe4) >> 8 & 0x200;
  *(uint *)((long)__s + 0x274) = uVar37 & 0xfffffc00 | uVar31 | uVar32 | uVar33 | uVar36;
  uVar20 = *(uint *)((long)pvVar6 + 0xe4) >> 8 & 0x400;
  *(uint *)((long)__s + 0x274) = uVar37 & 0xfffff800 | uVar31 | uVar32 | uVar33 | uVar36 | uVar20;
  uVar17 = (*(byte *)((long)pvVar6 + 0xec) & 0x1f) << 0xb;
  *(uint *)((long)__s + 0x274) =
       uVar37 & 0xffff0000 | uVar31 | uVar32 | uVar33 | uVar36 | uVar20 | uVar17;
  uVar21 = (*(byte *)((long)pvVar6 + 0xee) & 3) << 0x16;
  *(uint *)((long)__s + 0x274) =
       uVar37 & 0xff3f0000 | uVar31 | uVar32 | uVar33 | uVar36 | uVar20 | uVar17 | uVar21;
  uVar18 = (*(uint *)((long)pvVar6 + 0xe4) & 0x80000) << 6;
  *(uint *)((long)__s + 0x274) =
       uVar37 & 0xfd3f0000 | uVar31 | uVar32 | uVar33 | uVar36 | uVar20 | uVar17 | uVar21 | uVar18;
  uVar34 = (*(uint *)((long)pvVar6 + 0xe4) & 0x100000) << 6;
  *(uint *)((long)__s + 0x274) =
       uVar37 & 0xf93f0000 | uVar31 | uVar32 | uVar33 | uVar36 | uVar20 | uVar17 | uVar21 | uVar18 |
       uVar34;
  uVar11 = CONCAT22(*(undefined2 *)((long)__s + 0x27a),*(undefined2 *)((long)pvVar6 + 0xfc));
  *(uint *)((long)__s + 0x278) = uVar11;
  *(uint *)((long)__s + 0x278) =
       uVar11 & 0xfe00ffff | (*(ushort *)((long)pvVar6 + 0xfe) & 0x1ff) << 0x10;
  uVar27 = *(uint *)((long)pvVar6 + 0xe4) >> 0x15 & 1;
  uVar11 = *(uint *)((long)__s + 0x27c);
  *(uint *)((long)__s + 0x27c) = uVar11 & 0xfffffffe | uVar27;
  uVar11 = (uVar11 & 0xfffe0000 | uVar27) + (uint)*(ushort *)((long)pvVar6 + 0x100) * 2;
  *(uint *)((long)__s + 0x27c) = uVar11;
  *(uint *)((long)__s + 0x27c) = uVar11 & 0xff3fffff | (*(byte *)((long)pvVar6 + 0xf6) & 3) << 0x16;
  uVar11 = (*(uint *)((long)__s + 0x280) & 0xfbffffff) +
           (*(uint *)((long)pvVar6 + 0xe4) & 0x800000) * 8;
  *(uint *)((long)__s + 0x280) = uVar11;
  uVar27 = (uint)*(ushort *)((long)pvVar6 + 0x106) << 10;
  *(uint *)((long)__s + 0x280) = uVar11 & 0xfc0003ff | uVar27;
  uVar11 = (uVar11 & 0xdc0003ff | uVar27) + (*(uint *)((long)pvVar6 + 0xe4) & 0x4000000) * 8;
  *(uint *)((long)__s + 0x280) = uVar11;
  uVar11 = (uVar11 & 0xbfffffff) + (*(uint *)((long)pvVar6 + 0xe4) & 0x8000000) * 8;
  *(uint *)((long)__s + 0x280) = uVar11;
  uVar11 = (uVar11 & 0x7fffffff) + (*(uint *)((long)pvVar6 + 0xe4) & 0xf0000000) * 8;
  *(uint *)((long)__s + 0x280) = uVar11;
  uVar11 = (uVar11 & 0xfbffffff) + (*(uint *)((long)pvVar6 + 0xe4) & 0x800000) * 8;
  *(uint *)((long)__s + 0x280) = uVar11;
  uVar27 = (uint)*(ushort *)((long)pvVar6 + 0x106) << 10;
  *(uint *)((long)__s + 0x280) = uVar11 & 0xfc0003ff | uVar27;
  uVar11 = (uVar11 & 0xf40003ff | uVar27) + (*(uint *)((long)pvVar6 + 0xe4) & 0x1000000) * 8;
  *(uint *)((long)__s + 0x280) = uVar11;
  uVar27 = (*(byte *)((long)pvVar6 + 0xfa) & 0x1f) << 5;
  *(uint *)((long)__s + 0x280) = uVar11 & 0xfffffc1f | uVar27;
  uVar25 = *(uint *)((long)pvVar6 + 0xe4) >> 0x12 & 0x10;
  *(uint *)((long)__s + 0x280) = uVar11 & 0xfffffc0f | uVar27 | uVar25;
  uVar26 = *(byte *)((long)pvVar6 + 0xf9) & 0xf;
  *(uint *)((long)__s + 0x280) = uVar11 & 0xfffffc00 | uVar27 | uVar25 | uVar26;
  uVar35 = *(undefined2 *)((long)pvVar6 + 0x108);
  *(undefined2 *)((long)__s + 0x284) = uVar35;
  *(uint *)((long)__s + 0x284) = CONCAT22(*(undefined2 *)((long)pvVar6 + 0x10a),uVar35);
  uVar35 = *(undefined2 *)((long)pvVar6 + 0x10c);
  *(undefined2 *)((long)__s + 0x288) = uVar35;
  *(uint *)((long)__s + 0x288) = CONCAT22(*(undefined2 *)((long)pvVar6 + 0x10e),uVar35);
  uVar35 = *(undefined2 *)((long)pvVar6 + 0x110);
  *(undefined2 *)((long)__s + 0x28c) = uVar35;
  uVar2 = *(undefined2 *)((long)pvVar6 + 0x114);
  *(undefined2 *)((long)__s + 0x290) = uVar2;
  *(uint *)((long)__s + 0x28c) = CONCAT22(*(undefined2 *)((long)pvVar6 + 0x112),uVar35);
  *(uint *)((long)__s + 0x280) =
       (uVar11 & 0xeffffc00 | uVar27 | uVar25 | uVar26) +
       (*(uint *)((long)pvVar6 + 0xe4) & 0x2000000) * 8;
  *(uint *)((long)__s + 0x290) = CONCAT22(*(undefined2 *)((long)pvVar6 + 0x116),uVar2);
  *(uint *)((long)__s + 0x274) =
       uVar37 & 0x813f0000 | uVar31 | uVar32 | uVar33 | uVar36 | uVar20 | uVar17 | uVar21 | uVar18 |
       uVar34 | (*(byte *)((long)pvVar6 + 0xef) & 0xf) << 0x1b;
  *(uint *)((long)__s + 0x270) =
       uVar12 & 0x7fdf | uVar29 | uVar30 | uVar22 | uVar23 | uVar24 |
       *(uint *)((long)pvVar6 + 0xe4) >> 3 & 0x20;
  uVar38 = *(ushort *)((long)pvVar6 + 10);
  if (uVar38 == 0) {
    uVar38 = *(ushort *)((long)pvVar6 + 6);
  }
  uVar1 = *(ushort *)((long)pvVar6 + 8);
  dev = *(MppDev *)((long)hal + 0x68);
  uVar12 = *puVar7;
  MVar13 = mpp_frame_get_fmt(task->frame);
  if ((MVar13 & 0xf00000) == MPP_FMT_YUV420SP) {
    offset = (uint)uVar38 * (uint)uVar1;
    switch(uVar12) {
    case 0:
    case 1:
    case 2:
    case 8:
    case 9:
    case 10:
      goto switchD_0024a243_caseD_0;
    default:
      _mpp_log_l(2,"hal_h265e_v540c","unknown color space: %d\n","vepu540c_h265_set_patch_info",
                 (ulong)uVar12);
    case 7:
      offset_00 = offset * 5 >> 2;
      break;
    case 4:
    case 6:
      offset_00 = offset;
      break;
    case 5:
      offset_00 = offset * 3 >> 1;
    }
  }
  else {
    offset = mpp_frame_get_fbc_offset(task->frame);
    _mpp_log_l(4,"hal_h265e_v540c","fbc case u_offset = %d",(char *)0x0,(ulong)offset);
    offset_00 = 0;
  }
  if ((offset != 0) && (MVar14 = mpp_dev_set_reg_offset(dev,0xa1,offset), MVar14 != MPP_OK)) {
    _mpp_log_l(2,"hal_h265e_v540c","set input cb addr offset failed %d\n",
               "vepu540c_h265_set_patch_info",(ulong)(uint)MVar14);
  }
  if ((offset_00 != 0) && (MVar14 = mpp_dev_set_reg_offset(dev,0xa2,offset_00), MVar14 != MPP_OK)) {
    _mpp_log_l(2,"hal_h265e_v540c","set input cr addr offset failed %d\n",
               "vepu540c_h265_set_patch_info",(ulong)(uint)MVar14);
  }
switchD_0024a243_caseD_0:
  lVar8 = *(long *)((long)hal + 0x70);
  if (*(MppBuffer *)((long)hal + 0x218) == (MppBuffer)0x0) {
    *(undefined8 *)(lVar8 + 0x17c) = 0;
  }
  else {
    iVar28 = mpp_buffer_get_fd_with_caller
                       (*(MppBuffer *)((long)hal + 0x218),"setup_vepu540c_ext_line_buf");
    *(int *)(lVar8 + 0x180) = iVar28;
    *(int *)(lVar8 + 0x17c) = iVar28;
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x68),0xb2,*(RK_U32 *)((long)hal + 0x210));
  }
  lVar8 = *(long *)((long)hal + 0x1c0);
  uVar3 = *(undefined4 *)((long)pvVar6 + 0x28);
  if ((hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v540c","enter\n","vepu540c_h265_set_split");
  }
  iVar28 = *(int *)(lVar8 + 0xe94);
  if (iVar28 == 2) {
    iVar28 = *(int *)(lVar8 + 0xc);
    iVar4 = *(int *)(lVar8 + 0x10);
    uVar12 = *(uint *)(lVar8 + 0xe98);
    *(uint *)((long)__s + 0x214) = *(uint *)((long)__s + 0x214) & 0x80007ff8 | 0x1f48003;
    *(uint *)((long)__s + 0x21c) =
         *(uint *)((long)__s + 0x21c) & 0xfff00000 | *(int *)(lVar8 + 0xe98) - 1U & 0xfffff;
    *(uint *)((long)__s + 0x218) = *(uint *)((long)__s + 0x218) & 0xfff00000;
    iVar5 = *(int *)(lVar8 + 0xe9c);
    *(uint *)((long)__s + 0x1b4) =
         *(uint *)((long)__s + 0x1b4) & 0xbfffffff | (uint)(iVar5 != 0) << 0x1e;
    if (((*(byte *)(lVar8 + 0xe9c) & 1) != 0) ||
       ((bVar19 = (byte)uVar3 >> 7, iVar5 != 0 &&
        (8 < (uint)(CONCAT44(0 >> bVar19,
                             (iVar4 + 0x3f >> 6) * ((uint)(iVar28 + 0x3f >> 6) >> bVar19) + uVar12 +
                             -1) / (ulong)uVar12))))) {
      *(byte *)((long)__s + 0x20) = *(byte *)((long)__s + 0x20) | 8;
    }
  }
  else if (iVar28 == 1) {
    *(uint *)((long)__s + 0x214) = *(uint *)((long)__s + 0x214) & 0x80007ff8 | 0x1f48001;
    *(uint *)((long)__s + 0x21c) = *(uint *)((long)__s + 0x21c) & 0xfff00000;
    *(uint *)((long)__s + 0x218) =
         *(uint *)((long)__s + 0x218) & 0xfff00000 | *(uint *)(lVar8 + 0xe98) & 0xfffff;
    uVar12 = (uint)(*(int *)(lVar8 + 0xe9c) != 0) << 0x1e;
    *(uint *)((long)__s + 0x1b4) = *(uint *)((long)__s + 0x1b4) & 0xbfffffff | uVar12;
    *(uint *)((long)__s + 0x20) = *(uint *)((long)__s + 0x20) & 0xfffffff7 | uVar12 >> 0x1b;
  }
  else if (iVar28 == 0) {
    *(uint *)((long)__s + 0x21c) = *(uint *)((long)__s + 0x21c) & 0xfff00000;
    *(ulong *)((long)__s + 0x214) = *(ulong *)((long)__s + 0x214) & 0xfff0000080007ff8;
    *(byte *)((long)__s + 0x1b7) = *(byte *)((long)__s + 0x1b7) & 0xbf;
  }
  else {
    _mpp_log_l(4,"hal_h265e_v540c","invalide slice split mode %d\n","vepu540c_h265_set_split");
  }
  *(undefined4 *)(lVar8 + 0xe90) = 0;
  if ((hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v540c","leave\n","vepu540c_h265_set_split");
  }
  if (*(MppEncROICfg **)((long)hal + 0x1b8) != (MppEncROICfg *)0x0) {
    vepu540c_set_roi((void *)((long)__s + 0x3b8),*(MppEncROICfg **)((long)hal + 0x1b8),
                     *(RK_S32 *)(*(long *)((long)hal + 0x1c0) + 0xc),
                     *(RK_S32 *)(*(long *)((long)hal + 0x1c0) + 0x10));
  }
  lVar8 = *(long *)((long)hal + 0x1c0);
  *(uint *)((long)__s + 0x728) = *(uint *)((long)__s + 0x728) & 0xfe00 | 0x808011c;
  *(uint *)((long)__s + 0x72c) = *(uint *)((long)__s + 0x72c) & 0xe0000 | 9;
  *(uint *)((long)__s + 0x730) = *(uint *)((long)__s + 0x730) & 0xf000f000 | 0x180000;
  *(uint *)((long)__s + 0x734) = *(uint *)((long)__s + 0x734) & 0xf000f000 | 0x400030;
  *(uint *)((long)__s + 0x738) = *(uint *)((long)__s + 0x738) & 0xf000f000 | 0x200010;
  *(uint *)((long)__s + 0x73c) = *(uint *)((long)__s + 0x73c) & 0xf000f000 | 0x600030;
  *(uint *)((long)__s + 0x740) = *(uint *)((long)__s + 0x740) & 0xf000f000 | 0x180030;
  *(uint *)((long)__s + 0x744) = *(uint *)((long)__s + 0x744) & 0xf000f000 | 0x300060;
  *(uint *)((long)__s + 0x748) = *(uint *)((long)__s + 0x748) & 0xf0f0f0f0 | 0x3010301;
  *(uint *)((long)__s + 0x74c) = *(uint *)((long)__s + 0x74c) & 0xf0f0f0f0 | 0x4010401;
  *(uint *)((long)__s + 0x750) = *(uint *)((long)__s + 0x750) & 0xf0f0f0f0 | 0x3000300;
  *(uint *)((long)__s + 0x754) = *(uint *)((long)__s + 0x754) & 0xfffff0f0 | 0x301;
  *(uint *)((long)__s + 0x758) = *(uint *)((long)__s + 0x758) & 0xc0c0c0c0 | 0x9060906;
  *(uint *)((long)__s + 0x75c) = *(uint *)((long)__s + 0x75c) & 0xc0c0c0c0 | 0x8060b06;
  *(uint *)((long)__s + 0x760) = *(uint *)((long)__s + 0x760) & 0xc0c0c0c0 | 0x14061409;
  *(uint *)((long)__s + 0x764) = *(uint *)((long)__s + 0x764) & 0xffffc0c0 | 0x1007;
  *(ulong *)((long)__s + 0x768) =
       *(ulong *)((long)__s + 0x768) & 0xff000000ff00ff00 | (ulong)DAT_002ac900;
  *(ulong *)((long)__s + 0x778) =
       *(ulong *)((long)__s + 0x778) & 0xf000f000f000f000 | (ulong)DAT_002ac910;
  *(undefined4 *)((long)__s + 0x780) = 0x10101014;
  *(uint *)((long)__s + 0x79c) = *(uint *)((long)__s + 0x79c) & 0xfffff000 | 0x48;
  *(undefined4 *)((long)__s + 0x7a0) = 0x10101010;
  *(ulong *)((long)__s + 0x7b0) = *(ulong *)((long)__s + 0x7b0) & 0xfffff000f000f000 | 0x4800280014;
  *(undefined4 *)((long)__s + 0x7b8) = 0x1314191b;
  *(ulong *)((long)__s + 0x784) =
       *(ulong *)((long)__s + 0x784) & 0xf000f000ffffff00 | (ulong)DAT_002ac930;
  *(uint *)((long)__s + 0x78c) = *(uint *)((long)__s + 0x78c) & 0xf000f000 | 0x19000f;
  *(undefined4 *)((long)__s + 0x790) = 0x10101014;
  *(ulong *)((long)__s + 0x794) =
       *(ulong *)((long)__s + 0x794) & 0xf000f000ffffff00 | (ulong)DAT_002ac940;
  *(ulong *)((long)__s + 0x7a4) = *(ulong *)((long)__s + 0x7a4) & 0xfffff000f000f000 | 0x4800280014;
  *(undefined4 *)((long)__s + 0x7ac) = 0x10101010;
  *(ulong *)((long)__s + 0x7bc) = *(ulong *)((long)__s + 0x7bc) & 0xfffff000f000f000 | 0x4800280014;
  *(undefined4 *)((long)__s + 0x7c4) = 0x1014191b;
  *(ulong *)((long)__s + 0x7c8) =
       *(ulong *)((long)__s + 0x7c8) & 0xf0f0f0f0c0c0c0c0 | (ulong)DAT_002ac960;
  *(uint *)((long)__s + 2000) = *(uint *)((long)__s + 2000) & 0xc0c0c0c0 | 0x8081010;
  *(undefined4 *)((long)__s + 0x7d8) = 0x6030305;
  *(undefined2 *)((long)__s + 0x7dc) = 0xa07;
  *(undefined8 *)((long)__s + 0x7e0) = 0x120e090612131214;
  *(uint *)((long)__s + 0x7e8) = *(uint *)((long)__s + 0x7e8) & 0xfff80000 | 0x51111;
  *(undefined4 *)((long)__s + 0x7ec) = 0x6030305;
  *(undefined2 *)((long)__s + 0x7f0) = 0x705;
  *(undefined8 *)((long)__s + 0x7f4) = 0x120e090612131214;
  *(uint *)((long)__s + 0x7fc) = *(uint *)((long)__s + 0x7fc) & 0xfff80000 | 0x51111;
  *(uint *)((long)__s + 0x808) = *(uint *)((long)__s + 0x808) & 0xff8888c0 | 0x54431c;
  *(uint *)((long)__s + 0x80c) = *(uint *)((long)__s + 0x80c) & 0xff000000 | 0x192303;
  *(uint *)((long)__s + 0x810) = *(uint *)((long)__s + 0x810) & 0xff0000e0 | 0x181400;
  *(uint *)((long)__s + 0x814) = *(uint *)((long)__s + 0x814) & 0xff000000 | 0x180604;
  if (*(int *)((long)hal + 0x1ac) == 2) {
    for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
      *(undefined1 *)((long)__s + lVar16 + 0x37c) = *(undefined1 *)(lVar8 + 0x198 + lVar16 * 4);
      *(byte *)((long)__s + lVar16 + 0x38c) = *(byte *)(lVar8 + 0x218 + lVar16 * 4) & 0x3f;
    }
    *(uint *)((long)__s + 0x548) = *(uint *)((long)__s + 0x548) & 0xffffffe0 | 0xb;
    __src = lamd_moda_qp;
  }
  else {
    for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
      *(undefined1 *)((long)__s + lVar16 + 0x37c) = *(undefined1 *)(lVar8 + 0x1d8 + lVar16 * 4);
      *(byte *)((long)__s + lVar16 + 0x38c) = *(byte *)(lVar8 + 600 + lVar16 * 4) & 0x3f;
    }
    *(uint *)((long)__s + 0x548) = *(uint *)((long)__s + 0x548) & 0xffffffe0 | 0xb;
    __src = lamd_modb_qp;
  }
  memcpy((void *)((long)__s + 0x648),__src,0xd0);
  uVar12 = *(uint *)((long)__s + 0x478) & 0xfff00000;
  *(uint *)((long)__s + 0x478) = uVar12 + 0x154ab;
  if (*(int *)(lVar8 + 0x18c) != 0) {
    uVar11 = *(uint *)(lVar8 + 0x184) & 0x3ff;
    *(uint *)((long)__s + 0x478) = uVar11 + uVar12 + 0x15400;
    *(uint *)((long)__s + 0x478) = (*(uint *)(lVar8 + 0x188) & 0x3ff) << 10 | uVar11 | uVar12;
  }
  *(ulong *)((long)__s + 0x4a8) =
       *(ulong *)((long)__s + 0x4a8) & 0xe0080200ffff8008 | (ulong)DAT_002ac990;
  *(uint *)((long)__s + 0x4b0) = *(uint *)((long)__s + 0x4b0) & 0xfffff000 | 0x10;
  *(undefined4 *)((long)__s + 0x4b4) = 0x14100c08;
  auVar40._0_8_ = *(ulong *)((long)__s + 0x4b8) & 0xf000f000f000ff88;
  auVar40._8_4_ = *(uint *)((long)__s + 0x4c0) & 0xc0000000;
  auVar40._12_4_ = *(uint *)((long)__s + 0x4c4) & 0xff000000;
  *(undefined1 (*) [16])((long)__s + 0x4b8) = auVar40 | _DAT_002a00d0;
  *(int *)((long)hal + 500) = *(int *)((long)hal + 500) + 1;
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v540c","(%d) leave\n",(char *)0x0,0x53a);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_h265e_v540c_gen_regs(void *hal, HalEncTask *task)
{
    H265eV540cHalContext *ctx = (H265eV540cHalContext *)hal;
    HalEncTask *enc_task = task;
    H265eSyntax_new *syn = (H265eSyntax_new *)enc_task->syntax.data;
    H265eV540cRegSet *regs = ctx->regs;
    RK_U32 pic_width_align8, pic_height_align8;
    RK_S32 pic_wd32, pic_h32;
    VepuFmtCfg *fmt = (VepuFmtCfg *)ctx->input_fmt;
    hevc_vepu540c_control_cfg *reg_ctl = &regs->reg_ctl;
    hevc_vepu540c_base        *reg_base = &regs->reg_base;
    hevc_vepu540c_rc_roi *reg_klut = &regs->reg_rc_roi;

    hal_h265e_enter();
    pic_width_align8 = (syn->pp.pic_width + 7) & (~7);
    pic_height_align8 = (syn->pp.pic_height + 7) & (~7);
    pic_wd32 = (syn->pp.pic_width +  31) / 32;
    pic_h32 = (syn->pp.pic_height + 31) / 32;

    hal_h265e_dbg_simple("frame %d | type %d | start gen regs",
                         ctx->frame_cnt, ctx->frame_type);

    memset(regs, 0, sizeof(H265eV540cRegSet));

    reg_ctl->reg0004_enc_strt.lkt_num      = 0;
    reg_ctl->reg0004_enc_strt.vepu_cmd     = ctx->enc_mode;
    reg_ctl->reg0005_enc_clr.safe_clr      = 0x0;
    reg_ctl->reg0005_enc_clr.force_clr     = 0x0;

    reg_ctl->reg0008_int_en.enc_done_en        = 1;
    reg_ctl->reg0008_int_en.lkt_node_done_en   = 1;
    reg_ctl->reg0008_int_en.sclr_done_en       = 1;
    reg_ctl->reg0008_int_en.vslc_done_en       = 0;
    reg_ctl->reg0008_int_en.vbsf_oflw_en       = 1;
    reg_ctl->reg0008_int_en.vbuf_lens_en       = 1;
    reg_ctl->reg0008_int_en.enc_err_en         = 1;
    reg_ctl->reg0008_int_en.dvbm_fcfg_en       = 1;
    reg_ctl->reg0008_int_en.wdg_en             = 1;
    reg_ctl->reg0008_int_en.lkt_err_int_en     = 0;
    reg_ctl->reg0008_int_en.lkt_err_stop_en    = 1;
    reg_ctl->reg0008_int_en.lkt_force_stop_en  = 1;
    reg_ctl->reg0008_int_en.jslc_done_en       = 1;
    reg_ctl->reg0008_int_en.jbsf_oflw_en       = 1;
    reg_ctl->reg0008_int_en.jbuf_lens_en       = 1;
    reg_ctl->reg0008_int_en.dvbm_dcnt_en       = 1;

    reg_ctl->reg0012_dtrns_map.jpeg_bus_edin    = 0x0;
    reg_ctl->reg0012_dtrns_map.src_bus_edin     = 0x0;
    reg_ctl->reg0012_dtrns_map.meiw_bus_edin    = 0x0;
    reg_ctl->reg0012_dtrns_map.bsw_bus_edin     = 0x7;
    reg_ctl->reg0012_dtrns_map.lktr_bus_edin    = 0x0;
    reg_ctl->reg0012_dtrns_map.roir_bus_edin    = 0x0;
    reg_ctl->reg0012_dtrns_map.lktw_bus_edin    = 0x0;
    reg_ctl->reg0012_dtrns_map.rec_nfbc_bus_edin   = 0x0;
    /* enable rdo clk gating */
    {
        RK_U32 *rdo_ckg = (RK_U32*)&reg_ctl->reg0022_rdo_ckg;

        *rdo_ckg = 0xffffffff;
    }
//   reg_ctl->reg0013_dtrns_cfg.dspr_otsd        = (ctx->frame_type == INTER_P_FRAME);
    reg_ctl->reg0013_dtrns_cfg.axi_brsp_cke     = 0x0;
    reg_ctl->reg0014_enc_wdg.vs_load_thd        = 0x1fffff;
    reg_ctl->reg0014_enc_wdg.rfp_load_thd       = 0xff;

    reg_ctl->reg0021_func_en.cke                = 1;
    reg_ctl->reg0021_func_en.resetn_hw_en       = 1;
    reg_ctl->reg0021_func_en.enc_done_tmvp_en   = 1;

    reg_base->reg0196_enc_rsl.pic_wd8_m1    = pic_width_align8 / 8 - 1;
    reg_base->reg0197_src_fill.pic_wfill    = (syn->pp.pic_width & 0x7)
                                              ? (8 - (syn->pp.pic_width & 0x7)) : 0;
    reg_base->reg0196_enc_rsl.pic_hd8_m1    = pic_height_align8 / 8 - 1;
    reg_base->reg0197_src_fill.pic_hfill    = (syn->pp.pic_height & 0x7)
                                              ? (8 - (syn->pp.pic_height & 0x7)) : 0;

    reg_base->reg0192_enc_pic.enc_stnd      = 1; //H265
    reg_base->reg0192_enc_pic.cur_frm_ref   = !syn->sp.non_reference_flag; //current frame will be refered
    reg_base->reg0192_enc_pic.bs_scp        = 1;
    reg_base->reg0192_enc_pic.log2_ctu_num  = mpp_ceil_log2(pic_wd32 * pic_h32);

    reg_base->reg0203_src_proc.src_mirr = 0;
    reg_base->reg0203_src_proc.src_rot  = 0;

    reg_klut->klut_ofst.chrm_klut_ofst = (ctx->frame_type == INTRA_FRAME) ? 6 :
                                         (ctx->cfg->tune.scene_mode == MPP_ENC_SCENE_MODE_IPC ? 9 : 6);
    reg_klut->klut_ofst.inter_chrm_dist_multi = 4;
    reg_base->reg0248_sao_cfg.sao_lambda_multi = 5;

    vepu540c_h265_set_me_regs(ctx, syn, reg_base);

    reg_base->reg0232_rdo_cfg.chrm_spcl   = 0;
    reg_base->reg0232_rdo_cfg.cu_inter_e    = 0x0092;
    reg_base->reg0232_rdo_cfg.cu_intra_e    = 0xe;
    reg_base->reg0232_rdo_cfg.lambda_qp_use_avg_cu16_flag = 1;
    reg_base->reg0232_rdo_cfg.yuvskip_calc_en = 1;
    reg_base->reg0232_rdo_cfg.atf_e = 1;
    reg_base->reg0232_rdo_cfg.atr_e = 1;

    if (syn->pp.num_long_term_ref_pics_sps) {
        reg_base->reg0232_rdo_cfg.ltm_col   = 0;
        reg_base->reg0232_rdo_cfg.ltm_idx0l0 = 1;
    } else {
        reg_base->reg0232_rdo_cfg.ltm_col   = 0;
        reg_base->reg0232_rdo_cfg.ltm_idx0l0 = 0;
    }

    reg_base->reg0232_rdo_cfg.ccwa_e = 1;
    reg_base->reg0232_rdo_cfg.scl_lst_sel = syn->pp.scaling_list_enabled_flag;
    {
        RK_U32 i_nal_type = 0;

        /* TODO: extend syn->frame_coding_type definition */
        if (ctx->frame_type == INTRA_FRAME) {
            /* reset ref pictures */
            i_nal_type    = NAL_IDR_W_RADL;
        } else if (ctx->frame_type == INTER_P_FRAME ) {
            i_nal_type    = NAL_TRAIL_R;
        } else {
            i_nal_type    = NAL_TRAIL_R;
        }
        reg_base->reg0236_synt_nal.nal_unit_type    = syn->sp.temporal_id ? NAL_TSA_R : i_nal_type;
    }

    vepu540c_h265_set_hw_address(ctx, reg_base, task);
    vepu540c_h265_set_pp_regs(regs, fmt, &ctx->cfg->prep);
    vepu540c_h265_set_rc_regs(ctx, regs, task);
    vepu540c_h265_set_slice_regs(syn, reg_base);
    vepu540c_h265_set_ref_regs(syn, reg_base);
    vepu540c_h265_set_patch_info(ctx->dev, syn, (Vepu541Fmt)fmt->format, enc_task);
    setup_vepu540c_ext_line_buf(ctx, ctx->regs);
    vepu540c_h265_set_split(regs, ctx->cfg, syn->pp.tiles_enabled_flag);

    /* ROI configure */
    if (ctx->roi_data)
        vepu540c_set_roi(&regs->reg_rc_roi.roi_cfg, ctx->roi_data,
                         ctx->cfg->prep.width, ctx->cfg->prep.height);
    /*paramet cfg*/
    vepu540c_h265_global_cfg_set(ctx, regs);

    ctx->frame_num++;

    hal_h265e_leave();
    return MPP_OK;
}